

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O1

Error __thiscall asmjit::v1_14::BaseRAPass::addBlock(BaseRAPass *this,RABlock *block)

{
  uint uVar1;
  Error EVar2;
  
  EVar2 = 0;
  if (*(int *)&this->field_0xbc == *(int *)&this->field_0xb8) {
    EVar2 = ZoneVectorBase::_grow((ZoneVectorBase *)&this->_blocks,&this->_allocator,8,1);
  }
  if (EVar2 == 0) {
    uVar1 = *(uint *)&this->field_0xb8;
    *(uint *)(block + 8) = uVar1;
    if (*(uint *)&this->field_0xbc <= uVar1) {
      addBlock();
      return 3;
    }
    *(RABlock **)(*(long *)&this->_blocks + (ulong)uVar1 * 8) = block;
    *(int *)&this->field_0xb8 = *(int *)&this->field_0xb8 + 1;
    EVar2 = 0;
  }
  return EVar2;
}

Assistant:

Error BaseRAPass::addBlock(RABlock* block) noexcept {
  ASMJIT_PROPAGATE(_blocks.willGrow(allocator()));

  block->_blockId = blockCount();
  _blocks.appendUnsafe(block);
  return kErrorOk;
}